

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  ImDrawList *draw_list;
  ImGuiContext *pIVar1;
  float flags_00;
  uint uVar2;
  ImU32 col;
  ImGuiWindow *pIVar3;
  float local_c4;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  float local_80;
  float local_7c;
  float extra_w;
  float min_w;
  float local_70;
  float shortcut_w;
  ImVec2 local_64;
  float local_5c;
  byte local_55;
  float w;
  float fStack_50;
  bool pressed;
  ImGuiSelectableFlags flags;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  bool selected_local;
  char *shortcut_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_size = (pIVar3->DC).CursorPos;
    _fStack_50 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar2 = 8;
    if (enabled) {
      uVar2 = 0;
    }
    w = (float)(uVar2 | 0x2400000);
    if ((pIVar3->DC).LayoutType == 0) {
      local_5c = fStack_50;
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * 0.5) + (pIVar3->DC).CursorPos.x;
      ImVec2::ImVec2(&local_64,(pIVar1->Style).ItemSpacing.x * 2.0,(pIVar1->Style).ItemSpacing.y);
      PushStyleVar(0xd,&local_64);
      flags_00 = w;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,local_5c,0.0);
      local_55 = Selectable(label,false,(ImGuiSelectableFlags)flags_00,
                            (ImVec2 *)&stack0xffffffffffffff94);
      PopStyleVar(1);
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * -0.5) + (pIVar3->DC).CursorPos.x;
    }
    else {
      if (shortcut == (char *)0x0) {
        local_c4 = 0.0;
      }
      else {
        _extra_w = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        local_c4 = extra_w;
      }
      local_70 = local_c4;
      local_7c = ImGuiMenuColumns::DeclColumns
                           (&(pIVar3->DC).MenuColumns,fStack_50,local_c4,
                            (float)(int)(pIVar1->FontSize * 1.2));
      local_88 = GetContentRegionAvail();
      local_80 = ImMax<float>(0.0,local_88.x - local_7c);
      uVar2 = (uint)w | 0x800000;
      ImVec2::ImVec2(&local_90,local_7c,0.0);
      local_55 = Selectable(label,false,uVar2,&local_90);
      if (0.0 < local_70) {
        PushStyleColor(0,(pIVar1->Style).Colors + 1);
        ImVec2::ImVec2(&local_a0,(pIVar3->DC).MenuColumns.Pos[1] + local_80,0.0);
        local_98 = operator+(&label_size,&local_a0);
        RenderText(local_98,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        draw_list = pIVar3->DrawList;
        ImVec2::ImVec2(&local_b0,pIVar1->FontSize * 0.4 + (pIVar3->DC).MenuColumns.Pos[2] + local_80
                       ,pIVar1->FontSize * 0.134 * 0.5);
        local_a8 = operator+(&label_size,&local_b0);
        col = GetColorU32((byte)~enabled & 1,1.0);
        RenderCheckMark(draw_list,local_a8,col,pIVar1->FontSize * 0.866);
      }
    }
    label_local._7_1_ = (bool)(local_55 & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // We've been using the equivalent of ImGuiSelectableFlags_SetNavIdOnHover on all Selectable() since early Nav system days (commit 43ee5d73),
    // but I am unsure whether this should be kept at all. For now moved it to be an opt-in feature used by menus only.
    ImGuiSelectableFlags flags = ImGuiSelectableFlags_SelectOnRelease | ImGuiSelectableFlags_SetNavIdOnHover | (enabled ? 0 : ImGuiSelectableFlags_Disabled);
    bool pressed;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation we render neither the shortcut neither the selected tick mark
        float w = label_size.x;
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable(label, false, flags, ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu item inside a vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        float shortcut_w = shortcut ? CalcTextSize(shortcut, NULL).x : 0.0f;
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, shortcut_w, IM_FLOOR(g.FontSize * 1.20f)); // Feedback for next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, false, flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        if (shortcut_w > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(window->DC.MenuColumns.Pos[1] + extra_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled), g.FontSize  * 0.866f);
    }

    IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}